

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberToString.h
# Opt level: O2

json_string * NumberToString::_itoa<short>(json_string *__return_storage_ptr__,short val)

{
  bool bVar1;
  ushort uVar2;
  byte *pbVar3;
  byte *pbVar4;
  ulong uVar5;
  allocator local_11;
  allocator local_10;
  char num_str_result [7];
  
  num_str_result[6] = '\0';
  uVar2 = -val;
  if (0 < val) {
    uVar2 = val;
  }
  pbVar4 = (byte *)(num_str_result + 5);
  uVar5 = (ulong)uVar2;
  do {
    pbVar3 = pbVar4;
    *pbVar3 = (byte)(uVar5 % 10) | 0x30;
    pbVar4 = pbVar3 + -1;
    bVar1 = 9 < uVar5;
    uVar5 = uVar5 / 10;
  } while (bVar1);
  if (val < 0) {
    *pbVar4 = 0x2d;
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)pbVar4,&local_10);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)pbVar3,&local_11);
  }
  return __return_storage_ptr__;
}

Assistant:

static json_string _itoa(T val) json_nothrow {		
	   #ifdef JSON_LESS_MEMORY
		  json_auto<json_char> s(getLenSize<sizeof(T)>::GETLEN);
	   #else
		  json_char num_str_result[getLenSize<sizeof(T)>::GETLEN];
	   #endif
	   num_str_result[getLenSize<sizeof(T)>::GETLEN - 1] = JSON_TEXT('\0'); //null terminator
	   json_char * runner = &num_str_result[getLenSize<sizeof(T)>::GETLEN - 2];
	   bool negative;

	   START_MEM_SCOPE
	   long value = (long)val;
	   //first thing, check if it's negative, if so, make it positive
	   if (value < 0){
		  value = -value;
		  negative = true;
	   } else {
		  negative = false;
	   }

	   //create the string
	   do {
		  *runner-- = (json_char)(value % 10) + JSON_TEXT('0');
	   } while(value /= 10);
	   END_MEM_SCOPE

	   //if it's negative, add the negation
	   if (negative){
		  *runner = JSON_TEXT('-');
		  return json_string(runner);
	   }
	   return json_string(runner + 1);
    }